

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_token.c
# Opt level: O0

void simple_print_token(simple_token *t,unsigned_short depth,char *string)

{
  int local_24;
  int i;
  char *string_local;
  unsigned_short depth_local;
  simple_token *t_local;
  
  if (t != (simple_token *)0x0) {
    for (local_24 = 0; local_24 < (int)(uint)depth; local_24 = local_24 + 1) {
      fprintf(_stderr,"\t");
    }
    if (string == (char *)0x0) {
      fprintf(_stderr,"* (%d) %lu:%lu\n",(ulong)t->type,t->start,t->len);
    }
    else {
      fprintf(_stderr,"* (%d) %lu:%lu\t\'%.*s\'\n",(ulong)t->type,t->start,t->len,
              t->len & 0xffffffff,string + t->start);
    }
    if (t->child != (simple_token *)0x0) {
      simple_print_token_tree(t->child,depth + 1,string);
    }
  }
  return;
}

Assistant:

void simple_print_token(simple_token * t, unsigned short depth, const char * string) {
	if (t != NULL) {
		for (int i = 0; i < depth; ++i) {
			fprintf(stderr, "\t");
		}

		if (string == NULL) {
			fprintf(stderr, "* (%d) %lu:%lu\n", t->type, t->start, t->len);
		} else {
			fprintf(stderr, "* (%d) %lu:%lu\t'%.*s'\n", t->type, t->start, t->len, (int)t->len, &string[t->start]);
		}

		if (t->child != NULL) {
			simple_print_token_tree(t->child, depth + 1, string);
		}
	}
}